

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O1

void * crnd::crnd_default_realloc
                 (void *p,size_t size,size_t *pActual_size,bool movable,void *param_5)

{
  void *pvVar1;
  size_t sVar2;
  
  if (p == (void *)0x0) {
    pvVar1 = malloc(size);
    if (pActual_size == (size_t *)0x0) {
      return pvVar1;
    }
    p = pvVar1;
    if (pvVar1 == (void *)0x0) {
      sVar2 = 0;
      goto LAB_00111083;
    }
  }
  else {
    if (size == 0) {
      free(p);
      sVar2 = 0;
      pvVar1 = (void *)0x0;
      if (pActual_size == (size_t *)0x0) {
        return (void *)0x0;
      }
      goto LAB_00111083;
    }
    if (movable) {
      pvVar1 = realloc(p,size);
      if (pvVar1 != (void *)0x0) {
        p = pvVar1;
      }
    }
    else {
      pvVar1 = (void *)0x0;
    }
    if (pActual_size == (size_t *)0x0) {
      return pvVar1;
    }
  }
  sVar2 = malloc_usable_size(p);
LAB_00111083:
  *pActual_size = sVar2;
  return pvVar1;
}

Assistant:

static void* crnd_default_realloc(void* p, size_t size, size_t* pActual_size, bool movable, void*) {
  void* p_new;

  if (!p) {
    p_new = ::malloc(size);

    if (pActual_size) {
#ifdef WIN32
      *pActual_size = p_new ? ::_msize(p_new) : 0;
#else
      *pActual_size = p_new ? malloc_usable_size(p_new) : 0;
#endif
    }
  } else if (!size) {
    ::free(p);
    p_new = NULL;

    if (pActual_size)
      *pActual_size = 0;
  } else {
    void* p_final_block = p;
#ifdef WIN32
    p_new = ::_expand(p, size);
#else
    p_new = NULL;
#endif

    if (p_new)
      p_final_block = p_new;
    else if (movable) {
      p_new = ::realloc(p, size);

      if (p_new)
        p_final_block = p_new;
    }

    if (pActual_size) {
#ifdef WIN32
      *pActual_size = ::_msize(p_final_block);
#else
      *pActual_size = ::malloc_usable_size(p_final_block);
#endif
    }
  }

  return p_new;
}